

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Organya.cpp
# Opt level: O0

BOOL __thiscall OrgData::SetMusicInfo(OrgData *this,MUSICINFO *mi,unsigned_long flag)

{
  int local_24;
  int i;
  unsigned_long flag_local;
  MUSICINFO *mi_local;
  OrgData *this_local;
  
  if ((flag & 2) != 0) {
    (this->info).dot = mi->dot;
    (this->info).line = mi->line;
  }
  if ((flag & 1) != 0) {
    (this->info).wait = mi->wait;
  }
  if ((flag & 8) != 0) {
    (this->info).repeat_x = mi->repeat_x;
    (this->info).end_x = mi->end_x;
  }
  if ((flag & 0x10) != 0) {
    for (local_24 = 0; local_24 < 8; local_24 = local_24 + 1) {
      (this->info).tdata[local_24].freq = mi->tdata[local_24].freq;
      (this->info).tdata[local_24].pipi = (this->info).tdata[local_24].pipi;
    }
  }
  if ((flag & 0x20) != 0) {
    for (local_24 = 0; local_24 < 0x10; local_24 = local_24 + 1) {
      (this->info).tdata[local_24].wave_no = mi->tdata[local_24].wave_no;
    }
  }
  if ((flag & 0x40) != 0) {
    for (local_24 = 0; local_24 < 0x10; local_24 = local_24 + 1) {
      (this->info).tdata[local_24].pipi = mi->tdata[local_24].pipi;
    }
  }
  return true;
}

Assistant:

BOOL OrgData::SetMusicInfo(MUSICINFO *mi, unsigned long flag)
{
	int i;

	if (flag & SETGRID)	// グリッドを有効に (Enable grid)
	{
		info.dot = mi->dot;
		info.line = mi->line;
	}

	if (flag & SETWAIT)
	{
		info.wait = mi->wait;
	}

	if (flag & SETREPEAT)
	{
		info.repeat_x = mi->repeat_x;
		info.end_x = mi->end_x;
	}

	if (flag & SETFREQ)
	{
		for (i = 0; i < MAXMELODY; i++)
		{
			info.tdata[i].freq = mi->tdata[i].freq;
			info.tdata[i].pipi = info.tdata[i].pipi;	 // Just sets info.tdata[i].pipi to itself (SETPIPI already sets pipi, so maybe this line shouldn't be here in the first place)
		}
	}

	if (flag & SETWAVE)
		for (i = 0; i < MAXTRACK; i++)
			info.tdata[i].wave_no = mi->tdata[i].wave_no;

	if (flag & SETPIPI)
		for (i = 0; i < MAXTRACK; i++)
			info.tdata[i].pipi = mi->tdata[i].pipi;

	return TRUE;
}